

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::SwiftGetVersionCommand::getVerboseDescription
          (SwiftGetVersionCommand *this,SmallVectorImpl<char> *result)

{
  char *__n;
  raw_ostream *prVar1;
  char *in_RCX;
  void *__buf;
  void *__buf_00;
  StringRef Str;
  raw_ostream local_40;
  SmallVectorImpl<char> *local_18;
  
  prVar1 = &local_40;
  local_40.BufferMode = InternalBuffer;
  local_40.OutBufStart = (char *)0x0;
  local_40.OutBufEnd = (char *)0x0;
  local_40.OutBufCur = (char *)0x0;
  local_40._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00238e58;
  local_18 = result;
  llvm::raw_ostream::SetUnbuffered(prVar1);
  if (local_40.OutBufCur < local_40.OutBufEnd) {
    in_RCX = local_40.OutBufCur + 1;
    *local_40.OutBufCur = '\"';
    local_40.OutBufCur = in_RCX;
  }
  else {
    prVar1 = (raw_ostream *)llvm::raw_ostream::write(&local_40,0x22,__buf,(size_t)in_RCX);
  }
  prVar1 = (raw_ostream *)
           llvm::raw_ostream::write
                     (prVar1,(int)(this->executable)._M_dataplus._M_p,
                      (void *)(this->executable)._M_string_length,(size_t)in_RCX);
  __n = prVar1->OutBufCur;
  if (__n < prVar1->OutBufEnd) {
    prVar1->OutBufCur = __n + 1;
    *__n = '\"';
  }
  else {
    prVar1 = (raw_ostream *)llvm::raw_ostream::write(prVar1,0x22,__buf_00,(size_t)__n);
  }
  Str.Length = 10;
  Str.Data = " --version";
  llvm::raw_ostream::operator<<(prVar1,Str);
  llvm::raw_ostream::~raw_ostream(&local_40);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << '"' << executable << '"'
                                      << " --version";
  }